

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzskylmat.cpp
# Opt level: O2

TPZSkylMatrix<float> * __thiscall
TPZSkylMatrix<float>::operator*=(TPZSkylMatrix<float> *this,float value)

{
  float **ppfVar1;
  _func_int **pp_Var2;
  float **ppfVar3;
  float *pfVar4;
  int iVar5;
  int extraout_var;
  long lVar6;
  long lVar7;
  float *pfVar8;
  
  pp_Var2 = (this->super_TPZMatrix<float>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable;
  if (1e-06 <= ABS(value)) {
    iVar5 = (*pp_Var2[0xc])();
    ppfVar3 = (this->fElem).fStore;
    lVar7 = 0;
    lVar6 = CONCAT44(extraout_var,iVar5);
    if (CONCAT44(extraout_var,iVar5) == 0 || extraout_var < 0) {
      lVar6 = lVar7;
    }
    while (lVar7 != lVar6) {
      ppfVar1 = ppfVar3 + lVar7;
      pfVar4 = ppfVar3[lVar7 + 1];
      lVar7 = lVar7 + 1;
      for (pfVar8 = *ppfVar1; pfVar8 < pfVar4; pfVar8 = pfVar8 + 1) {
        *pfVar8 = *pfVar8 * value;
      }
    }
    (this->super_TPZMatrix<float>).super_TPZBaseMatrix.fDecomposed = '\0';
  }
  else {
    (*pp_Var2[0xf])();
  }
  return this;
}

Assistant:

TPZSkylMatrix<TVar> &
TPZSkylMatrix<TVar>::operator*=(const TVar value )
{
	if ( IsZero( value ) )
    {
		Zero();
		return( *this );
    }
	
	int64_t col, colmax = this->Dim();
	for (col=0; col<colmax; col++ )
    {
		// Efetua a MULTIPLICACAO.
		TVar *elem = fElem[col];
		TVar *end  = fElem[col+1];
		while ( elem < end ) *elem++ *= value;
    }
	
	this->fDecomposed = 0;
	return( *this );
}